

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O0

void __thiscall
TasGrid::GridLocalPolynomial::evaluateBatch(GridLocalPolynomial *this,double *x,int num_x,double *y)

{
  pointer *this_00;
  pointer *this_01;
  double dVar1;
  TypeAcceleration TVar2;
  int iVar3;
  int new_stride;
  double *pdVar4;
  double *pdVar5;
  reference pvVar6;
  reference pvVar7;
  int local_13c;
  int k;
  double *s;
  double v;
  double dStack_120;
  int j_1;
  double *local_118;
  double *this_y;
  undefined1 local_108 [4];
  int i_1;
  Wrapper2D<double> ywrap;
  int j;
  double *row;
  undefined1 local_e0 [4];
  int i;
  Data2D<double> A;
  double total_size;
  double nnz;
  undefined1 local_a0 [4];
  int num_points;
  vector<double,_std::allocator<double>_> svals;
  vector<int,_std::allocator<int>_> spntr;
  vector<int,_std::allocator<int>_> sindx;
  undefined1 local_48 [8];
  GpuVector<double> gpu_result;
  GpuVector<double> gpu_x;
  double *y_local;
  int num_x_local;
  double *x_local;
  GridLocalPolynomial *this_local;
  
  TVar2 = ((this->super_BaseCanonicalGrid).acceleration)->mode;
  if (TVar2 == accel_cpu_blas) {
    if ((((this->super_BaseCanonicalGrid).acceleration)->algorithm_select == algorithm_sparse) ||
       ((((this->super_BaseCanonicalGrid).acceleration)->algorithm_select == algorithm_autoselect &&
        ((this->super_BaseCanonicalGrid).num_outputs < 0x401)))) {
      evaluateBatchOpenMP(this,x,num_x,y);
    }
    else {
      this_00 = &spntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_end_of_storage;
      ::std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)this_00)
      ;
      this_01 = &svals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      ::std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)this_01)
      ;
      ::std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_a0);
      buildSpareBasisMatrix
                (this,x,num_x,0x20,(vector<int,_std::allocator<int>_> *)this_01,
                 (vector<int,_std::allocator<int>_> *)this_00,
                 (vector<double,_std::allocator<double>_> *)local_a0);
      new_stride = MultiIndexSet::getNumIndexes(&(this->super_BaseCanonicalGrid).points);
      pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &svals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)num_x);
      A.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)((double)num_x * (double)new_stride);
      if ((((this->super_BaseCanonicalGrid).acceleration)->algorithm_select == algorithm_dense) ||
         ((((this->super_BaseCanonicalGrid).acceleration)->algorithm_select == algorithm_autoselect
          && (0.1 < (double)*pvVar6 /
                    (double)A.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage)))) {
        Data2D<double>::Data2D<int,int>((Data2D<double> *)local_e0,new_stride,num_x,0.0);
        for (row._4_4_ = 0; row._4_4_ < num_x; row._4_4_ = row._4_4_ + 1) {
          pdVar4 = Data2D<double>::getStrip((Data2D<double> *)local_e0,row._4_4_);
          pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              &svals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,(long)row._4_4_);
          ywrap.data._4_4_ = *pvVar6;
          while( true ) {
            iVar3 = ywrap.data._4_4_;
            pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                &svals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,(long)(row._4_4_ + 1));
            if (*pvVar6 <= iVar3) break;
            pvVar7 = ::std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_a0,
                                (long)ywrap.data._4_4_);
            dVar1 = *pvVar7;
            pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                &spntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,(long)ywrap.data._4_4_);
            pdVar4[*pvVar6] = dVar1;
            ywrap.data._4_4_ = ywrap.data._4_4_ + 1;
          }
        }
        iVar3 = (this->super_BaseCanonicalGrid).num_outputs;
        pdVar4 = Data2D<double>::getStrip(&this->surpluses,0);
        pdVar5 = Data2D<double>::getStrip((Data2D<double> *)local_e0,0);
        TasBLAS::denseMultiply<double>(iVar3,num_x,new_stride,1.0,pdVar4,pdVar5,0.0,y);
        Data2D<double>::~Data2D((Data2D<double> *)local_e0);
      }
      else {
        Utils::Wrapper2D<double>::Wrapper2D
                  ((Wrapper2D<double> *)local_108,(this->super_BaseCanonicalGrid).num_outputs,y);
        for (this_y._4_4_ = 0; this_y._4_4_ < num_x; this_y._4_4_ = this_y._4_4_ + 1) {
          local_118 = Utils::Wrapper2D<double>::getStrip
                                ((Wrapper2D<double> *)local_108,this_y._4_4_);
          dStack_120 = 0.0;
          ::std::fill<double*,double>
                    (local_118,local_118 + (this->super_BaseCanonicalGrid).num_outputs,
                     &stack0xfffffffffffffee0);
          pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              &svals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,(long)this_y._4_4_);
          v._4_4_ = *pvVar6;
          while( true ) {
            pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                &svals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,(long)(this_y._4_4_ + 1))
            ;
            if (*pvVar6 <= v._4_4_) break;
            pvVar7 = ::std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_a0,(long)v._4_4_);
            dVar1 = *pvVar7;
            pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                &spntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,(long)v._4_4_);
            pdVar4 = Data2D<double>::getStrip(&this->surpluses,*pvVar6);
            for (local_13c = 0; local_13c < (this->super_BaseCanonicalGrid).num_outputs;
                local_13c = local_13c + 1) {
              local_118[local_13c] = dVar1 * pdVar4[local_13c] + local_118[local_13c];
            }
            v._4_4_ = v._4_4_ + 1;
          }
        }
        Utils::Wrapper2D<double>::~Wrapper2D((Wrapper2D<double> *)local_108);
      }
      ::std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_a0);
      ::std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 &svals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      ::std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 &spntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
  }
  else if (TVar2 == accel_gpu_cublas) {
    AccelerationContext::setDevice((this->super_BaseCanonicalGrid).acceleration);
    evaluateGpuMixed(this,x,num_x,y);
  }
  else if (TVar2 == accel_gpu_cuda || TVar2 == accel_gpu_magma) {
    AccelerationContext::setDevice((this->super_BaseCanonicalGrid).acceleration);
    if (((this->order == -1) || (2 < this->order)) || (num_x == 1)) {
      evaluateGpuMixed(this,x,num_x,y);
    }
    else {
      GpuVector<double>::GpuVector
                ((GpuVector<double> *)&gpu_result.gpu_data,
                 (this->super_BaseCanonicalGrid).acceleration,
                 (this->super_BaseCanonicalGrid).num_dimensions,num_x,x);
      GpuVector<double>::GpuVector
                ((GpuVector<double> *)local_48,(this->super_BaseCanonicalGrid).acceleration,num_x,
                 (this->super_BaseCanonicalGrid).num_outputs);
      pdVar4 = GpuVector<double>::data((GpuVector<double> *)&gpu_result.gpu_data);
      pdVar5 = GpuVector<double>::data((GpuVector<double> *)local_48);
      (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x14])
                (this,pdVar4,(ulong)(uint)num_x,pdVar5);
      GpuVector<double>::unload
                ((GpuVector<double> *)local_48,(this->super_BaseCanonicalGrid).acceleration,y);
      GpuVector<double>::~GpuVector((GpuVector<double> *)local_48);
      GpuVector<double>::~GpuVector((GpuVector<double> *)&gpu_result.gpu_data);
    }
  }
  else {
    evaluateBatchOpenMP(this,x,num_x,y);
  }
  return;
}

Assistant:

void GridLocalPolynomial::evaluateBatch(const double x[], int num_x, double y[]) const{
    switch(acceleration->mode){
        case accel_gpu_magma:
        case accel_gpu_cuda: {
            acceleration->setDevice();
            if ((order == -1) || (order > 2) || (num_x == 1)){
                // GPU evaluations are available only for order 0, 1, and 2. Cubic will come later, but higher order will not be supported.
                // cannot use GPU to accelerate the evaluation of a single vector
                evaluateGpuMixed(x, num_x, y);
                return;
            }
            GpuVector<double> gpu_x(acceleration, num_dimensions, num_x, x), gpu_result(acceleration, num_x, num_outputs);
            evaluateBatchGPU(gpu_x.data(), num_x, gpu_result.data());
            gpu_result.unload(acceleration, y);
            break;
        }
        case accel_gpu_cublas: {
            acceleration->setDevice();
            evaluateGpuMixed(x, num_x, y);
            break;
        }
        case accel_cpu_blas: {
            if (acceleration->algorithm_select == AccelerationContext::algorithm_sparse or
                (acceleration->algorithm_select == AccelerationContext::algorithm_autoselect and num_outputs <= 1024)){
                evaluateBatchOpenMP(x, num_x, y);
                return;
            }

            std::vector<int> sindx, spntr;
            std::vector<double> svals;
            buildSpareBasisMatrix(x, num_x, 32, spntr, sindx, svals); // build sparse matrix corresponding to x

            int num_points = points.getNumIndexes();
            double nnz = (double) spntr[num_x];
            double total_size = ((double) num_x) * ((double) num_points);

            if ((acceleration->algorithm_select == AccelerationContext::algorithm_dense)
                or ((acceleration->algorithm_select == AccelerationContext::algorithm_autoselect) and (nnz / total_size > 0.1))){
                // potentially wastes a lot of memory
                Data2D<double> A(num_points, num_x, 0.0);
                for(int i=0; i<num_x; i++){
                    double *row = A.getStrip(i);
                    for(int j=spntr[i]; j<spntr[i+1]; j++) row[sindx[j]] = svals[j];
                }
                TasBLAS::denseMultiply(num_outputs, num_x, num_points, 1.0, surpluses.getStrip(0), A.getStrip(0), 0.0, y);
            }else{
                Utils::Wrapper2D<double> ywrap(num_outputs, y);
                #pragma omp parallel for
                for(int i=0; i<num_x; i++){
                    double *this_y = ywrap.getStrip(i);
                    std::fill(this_y, this_y + num_outputs, 0.0);
                    for(int j=spntr[i]; j<spntr[i+1]; j++){
                        double v = svals[j];
                        const double *s = surpluses.getStrip(sindx[j]);
                        for(int k=0; k<num_outputs; k++) this_y[k] += v * s[k];
                    }
                }
            }
            break;
        }
        default: {
            evaluateBatchOpenMP(x, num_x, y);
            break;
        }
    }
}